

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  mapped_type *this_00;
  cmStateSnapshot local_98;
  undefined1 local_70 [8];
  string snpProjName;
  string name;
  cmStateSnapshot snp;
  uint i;
  cmGlobalGenerator *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&this->ProjectMap);
  for (snp.Position.Position._4_4_ = 0;
      sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), snp.Position.Position._4_4_ < sVar2;
      snp.Position.Position._4_4_ = snp.Position.Position._4_4_ + 1) {
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)snp.Position.Position._4_4_);
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)((long)&name.field_2 + 8),*ppcVar3);
    std::__cxx11::string::string((string *)(snpProjName.field_2._M_local_buf + 8));
    do {
      cmStateSnapshot::GetProjectName_abi_cxx11_
                ((string *)local_70,(cmStateSnapshot *)((long)&name.field_2 + 8));
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&snpProjName.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)(snpProjName.field_2._M_local_buf + 8),(string *)local_70);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,(key_type *)((long)&snpProjName.field_2 + 8));
        ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)snp.Position.Position._4_4_);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,ppcVar3);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                (&local_98,(cmStateSnapshot *)((long)&name.field_2 + 8));
      name.field_2._8_8_ = local_98.State;
      std::__cxx11::string::~string((string *)local_70);
      bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)((long)&name.field_2 + 8));
    } while (bVar1);
    std::__cxx11::string::~string((string *)(snpProjName.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  unsigned int i;
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    // for each local generator add all projects
    cmStateSnapshot snp = this->LocalGenerators[i]->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(this->LocalGenerators[i]);
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}